

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaCommand.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_5ec65::ParseCommandActions::actOnDefaultDecl
          (ParseCommandActions *this,ArrayRef<llbuild::ninja::Token> names)

{
  ostream *poVar1;
  string local_68;
  Token *local_48;
  Token *name;
  iterator __end2;
  iterator __begin2;
  ArrayRef<llbuild::ninja::Token> *__range2;
  ParseCommandActions *pPStack_20;
  bool first;
  ParseCommandActions *this_local;
  ArrayRef<llbuild::ninja::Token> names_local;
  
  names_local.Data = (Token *)names.Length;
  this_local = (ParseCommandActions *)names.Data;
  pPStack_20 = this;
  poVar1 = std::operator<<((ostream *)&std::cerr,"actOnDefaultDecl");
  std::operator<<(poVar1,"(/*Names=*/[");
  __range2._7_1_ = 1;
  __begin2 = (iterator)&this_local;
  __end2 = llvm::ArrayRef<llbuild::ninja::Token>::begin((ArrayRef<llbuild::ninja::Token> *)__begin2)
  ;
  name = llvm::ArrayRef<llbuild::ninja::Token>::end((ArrayRef<llbuild::ninja::Token> *)__begin2);
  for (; __end2 != name; __end2 = __end2 + 1) {
    local_48 = __end2;
    if ((__range2._7_1_ & 1) == 0) {
      std::operator<<((ostream *)&std::cerr,", ");
    }
    poVar1 = std::operator<<((ostream *)&std::cerr,"\"");
    escapedString_abi_cxx11_(&local_68,local_48);
    poVar1 = std::operator<<(poVar1,(string *)&local_68);
    std::operator<<(poVar1,"\"");
    std::__cxx11::string::~string((string *)&local_68);
    __range2._7_1_ = 0;
  }
  std::operator<<((ostream *)&std::cerr,"])\n");
  return;
}

Assistant:

virtual void actOnDefaultDecl(ArrayRef<ninja::Token> names) override {
    std::cerr << __FUNCTION__ << "(/*Names=*/[";
    bool first = true;
    for (auto& name: names) {
      if (!first)
        std::cerr << ", ";
      std::cerr << "\"" << escapedString(name) << "\"";
      first = false;
    }
    std::cerr << "])\n";
  }